

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O2

void __thiscall
adios2::transport::ShmSystemV::ShmSystemV
          (ShmSystemV *this,uint projectID,size_t size,Comm *comm,bool removeAtClose)

{
  allocator local_ec;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"Shm",(allocator *)&local_c8);
  std::__cxx11::string::string((string *)&local_68,"SystemV",(allocator *)&local_e8);
  Transport::Transport(&this->super_Transport,&local_48,&local_68,comm);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__ShmSystemV_00824a90;
  (this->m_PathName)._M_dataplus._M_p = (pointer)&(this->m_PathName).field_2;
  (this->m_PathName)._M_string_length = 0;
  (this->m_PathName).field_2._M_local_buf[0] = '\0';
  this->m_ProjectID = projectID;
  this->m_ShmID = -1;
  this->m_Buffer = (char *)0x0;
  this->m_Size = size;
  this->m_RemoveAtClose = removeAtClose;
  if (projectID == 0) {
    std::__cxx11::string::string((string *)&local_c8,"Toolkit",&local_e9);
    std::__cxx11::string::string((string *)&local_e8,"transport::shm::ShmSystemV",&local_ea);
    std::__cxx11::string::string((string *)&local_88,"ShmSystemV",&local_eb);
    std::__cxx11::string::string
              ((string *)&local_a8,"projectID can\'t be zero, in shared memory segment",&local_ec);
    helper::Throw<std::invalid_argument>(&local_c8,&local_e8,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

ShmSystemV::ShmSystemV(const unsigned int projectID, const size_t size, helper::Comm const &comm,
                       const bool removeAtClose)
: Transport("Shm", "SystemV", comm), m_ProjectID(projectID), m_Size(size),
  m_RemoveAtClose(removeAtClose)
{
    if (projectID == 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "transport::shm::ShmSystemV", "ShmSystemV",
                                             "projectID can't be zero, in shared memory segment");
    }
}